

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskFileIndex.cpp
# Opt level: O0

void __thiscall
OnDiskFileIndex::OnDiskFileIndex
          (OnDiskFileIndex *this,path *db_base,string *files_fname,string *cache_fname)

{
  byte bVar1;
  ulong uVar2;
  path *__args;
  string *in_RCX;
  string *in_RDX;
  path *in_RSI;
  long *in_RDI;
  path *this_00;
  OnDiskFileIndex *in_stack_00000050;
  path *in_stack_fffffffffffffd48;
  path *in_stack_fffffffffffffd50;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  path *in_stack_fffffffffffffd70;
  path *in_stack_fffffffffffffd78;
  path *__lhs;
  int in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc4;
  string *in_stack_fffffffffffffdc8;
  RawFile *in_stack_fffffffffffffdd0;
  path local_190 [5];
  string local_50 [48];
  string *local_20;
  string *local_18;
  path *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::experimental::filesystem::v1::__cxx11::path::path
            (in_stack_fffffffffffffd70,
             (path *)CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
  std::__cxx11::string::string((string *)(in_RDI + 9),local_18);
  std::__cxx11::string::string((string *)(in_RDI + 0xd),local_20);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_fffffffffffffd70,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
  std::experimental::filesystem::v1::__cxx11::operator/
            (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
            (in_stack_fffffffffffffd48);
  RawFile::RawFile(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,
                   in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(local_50);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd50);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd50);
  this_00 = (path *)((long)in_RDI + 0x8c);
  std::optional<RawFile>::optional((optional<RawFile> *)0x1cc110);
  __lhs = local_10;
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
  std::experimental::filesystem::v1::__cxx11::operator/(__lhs,this_00);
  bVar1 = std::experimental::filesystem::v1::exists(in_stack_fffffffffffffd50);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd50);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd50);
  if ((bVar1 & 1) == 0) {
    generate_namecache_file(in_stack_00000050);
  }
  else {
    std::experimental::filesystem::v1::__cxx11::path::
    path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffffd68));
    std::experimental::filesystem::v1::__cxx11::operator/(__lhs,this_00);
    uVar2 = std::experimental::filesystem::v1::file_size(local_190);
    *in_RDI = (uVar2 >> 3) - 1;
    std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd50);
    std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffd50);
  }
  __args = (path *)((long)in_RDI + 0x8c);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(bVar1,in_stack_fffffffffffffd68));
  std::experimental::filesystem::v1::__cxx11::operator/(__lhs,this_00);
  std::optional<RawFile>::emplace<std::experimental::filesystem::v1::__cxx11::path>
            ((optional<RawFile> *)local_10,__args);
  std::experimental::filesystem::v1::__cxx11::path::~path(local_10);
  std::experimental::filesystem::v1::__cxx11::path::~path(local_10);
  return;
}

Assistant:

OnDiskFileIndex::OnDiskFileIndex(const fs::path &db_base,
                                 const std::string &files_fname,
                                 const std::string &cache_fname)
    : db_base(db_base),
      files_fname(files_fname),
      cache_fname(cache_fname),
      files_file(db_base / files_fname) {  // <- cool race condition here
    if (fs::exists(db_base / cache_fname)) {
        file_count = fs::file_size(db_base / cache_fname) / 8 - 1;
    } else {
        generate_namecache_file();
    }
    cache_file.emplace(db_base / cache_fname);
}